

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UserDefinedIOTestInstance *this)

{
  VkDeviceSize bufferSize;
  void **ppvVar1;
  uint uVar2;
  IOType IVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  TestLog *pTVar5;
  uint *puVar6;
  TopLevelObject *pTVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  UserDefinedIOTestInstance *pUVar8;
  VkCommandBuffer commandBuffer;
  Allocation *pAVar9;
  bool bVar10;
  deUint32 queueFamilyIndex;
  int iVar11;
  int iVar12;
  deUint32 stride;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  TextureFormat TVar13;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  GraphicsPipelineBuilder *pGVar14;
  const_iterator cVar15;
  pointer pSVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  VkDeviceSize bufferSize_00;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  ConstPixelBufferAccess resultImageAccess;
  undefined1 local_4c0 [40];
  long local_498;
  long *plStack_490;
  VkAccessFlags local_488;
  VkAccessFlags VStack_484;
  VkImageLayout VStack_480;
  VkImageLayout VStack_47c;
  key_type local_478;
  key_type local_458;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  ios_base local_3c0 [132];
  deUint32 local_33c;
  bool local_338;
  VkPrimitiveTopology local_334;
  VkRenderPass local_2b8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_2b0;
  VkQueue local_298;
  UserDefinedIOTestInstance *local_290;
  VkCommandBuffer local_288;
  long *plStack_280;
  VkAccessFlags local_278;
  VkAccessFlags VStack_274;
  VkImageLayout VStack_270;
  VkImageLayout VStack_26c;
  VkPipelineLayout local_268;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_260;
  TextureFormat local_248;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_240;
  key_type local_228;
  Image local_208;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  TextureFormat local_178;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_170;
  VkCommandPool local_158;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_150;
  VkFramebuffer local_138;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_130;
  VkImageView local_118;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_110;
  VkDescriptorPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_f0;
  Buffer local_d8;
  Buffer local_a8;
  VkDescriptorBufferInfo resultBufferInfo;
  Buffer local_60;
  
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,9);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_298 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar11 = referenceVertexCount
                     ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                      iterate::attributes + 2);
  local_290 = this;
  iVar12 = referenceVertexCount
                     ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,true,iterate::attributes,
                      iterate::attributes + 2);
  TVar13 = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(TVar13);
  uVar20 = (ulong)(stride * 10);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,uVar20,0x80);
  tessellation::Buffer::Buffer
            (&local_60,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  pAVar9 = local_60.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy((local_60.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,iterate::attributes,uVar20);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar9->m_memory).m_internal,pAVar9->m_offset,uVar20);
  bufferSize = (long)iVar11 * 4 + 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&local_a8,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  pAVar9 = local_a8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset((local_a8.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar9->m_memory).m_internal,pAVar9->m_offset,bufferSize);
  pUVar8 = local_290;
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&colorAttachmentLayoutBarrier,&renderSize,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&local_208,vk,device,allocator,(VkImageCreateInfo *)&colorAttachmentLayoutBarrier,
               (MemoryRequirement)0x0);
  iVar18 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar13 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar11 = tcu::getPixelSize(TVar13);
  bufferSize_00 = (VkDeviceSize)(iVar18 * iVar11);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize_00,2);
  tessellation::Buffer::Buffer
            (&local_d8,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&resultImageAccess,this_00,vk,device,0);
  DStack_240.m_device = (VkDevice)resultImageAccess._16_8_;
  DStack_240.m_allocator = (VkAllocationCallbacks *)resultImageAccess.m_pitch.m_data._4_8_;
  local_248 = resultImageAccess.m_format;
  DStack_240.m_deviceIface = (DeviceInterface *)resultImageAccess.m_size.m_data._0_8_;
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  resultImageAccess.m_size.m_data[0] = 0;
  resultImageAccess.m_size.m_data[1] = 0;
  resultImageAccess.m_size.m_data[2] = 0;
  resultImageAccess.m_pitch.m_data[0] = 0;
  resultImageAccess.m_pitch.m_data[1] = 0;
  resultImageAccess.m_pitch.m_data[2] = 0;
  if (colorAttachmentLayoutBarrier.subresourceRange._0_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier.subresourceRange._0_8_,
                    colorAttachmentLayoutBarrier._64_8_ -
                    colorAttachmentLayoutBarrier.subresourceRange._0_8_);
  }
  if (colorAttachmentLayoutBarrier._24_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier._24_8_,
                    colorAttachmentLayoutBarrier.image.m_internal -
                    colorAttachmentLayoutBarrier._24_8_);
  }
  if (colorAttachmentLayoutBarrier._0_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    colorAttachmentLayoutBarrier._16_8_ - colorAttachmentLayoutBarrier._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&resultImageAccess);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&resultImageAccess,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER
                       ,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&colorAttachmentLayoutBarrier,this_01,vk,
             device,1,1);
  DStack_f0.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_f8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_f0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (resultImageAccess.m_format != (TextureFormat)0x0) {
    operator_delete((void *)resultImageAccess.m_format,
                    resultImageAccess._16_8_ - (long)resultImageAccess.m_format);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&colorAttachmentLayoutBarrier,vk,device
                    ,local_f8,(VkDescriptorSetLayout)local_248);
  local_488 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_484 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_480 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_47c = colorAttachmentLayoutBarrier.newLayout;
  local_498 = colorAttachmentLayoutBarrier._0_8_;
  plStack_490 = (long *)colorAttachmentLayoutBarrier.pNext;
  resultBufferInfo.buffer.m_internal =
       local_a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier,(int)local_498,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (colorAttachmentLayoutBarrier.subresourceRange._0_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier.subresourceRange._0_8_,
                    colorAttachmentLayoutBarrier._64_8_ -
                    colorAttachmentLayoutBarrier.subresourceRange._0_8_);
  }
  if (colorAttachmentLayoutBarrier._24_8_ != 0) {
    operator_delete((void *)colorAttachmentLayoutBarrier._24_8_,
                    colorAttachmentLayoutBarrier.image.m_internal -
                    colorAttachmentLayoutBarrier._24_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&colorAttachmentLayoutBarrier);
  local_198 = 1;
  uStack_190 = 1;
  local_188 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_110.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_110.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_118.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_110.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_2b0.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_2b0.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_2b8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_2b0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)colorAttachmentLayoutBarrier._0_8_,local_118,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  DStack_130.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_130.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_138.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_130.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier,vk,
                     device,(VkDescriptorSetLayout)local_248);
  DStack_260.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_260.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_268.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_260.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  queueFamilyIndex);
  DStack_150.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_150.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_158.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_150.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)colorAttachmentLayoutBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_278 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_274 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_270 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_26c = colorAttachmentLayoutBarrier.newLayout;
  local_288 = (VkCommandBuffer)colorAttachmentLayoutBarrier._0_8_;
  plStack_280 = (long *)colorAttachmentLayoutBarrier.pNext;
  memset(&colorAttachmentLayoutBarrier.pNext,0,0xf4);
  local_338 = false;
  local_334 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  colorAttachmentLayoutBarrier.sType = renderSize.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = renderSize.m_data[1];
  local_33c = 10;
  pGVar14 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,VK_FORMAT_R32_SFLOAT
                       ,stride);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar8->super_TestInstance).m_context)->m_progCollection;
  local_4c0._0_8_ = (long)local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"vert","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)local_4c0);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar15._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar8->super_TestInstance).m_context)->m_progCollection;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"tesc","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_458);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar15._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar8->super_TestInstance).m_context)->m_progCollection;
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"tese","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_478);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar15._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pUVar8->super_TestInstance).m_context)->m_progCollection;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"frag","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_228);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar15._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&resultImageAccess,pGVar14,vk,device,local_268
             ,local_2b8);
  DStack_170.m_device = (VkDevice)resultImageAccess._16_8_;
  DStack_170.m_allocator = (VkAllocationCallbacks *)resultImageAccess.m_pitch.m_data._4_8_;
  local_178 = resultImageAccess.m_format;
  DStack_170.m_deviceIface = (DeviceInterface *)resultImageAccess.m_size.m_data._0_8_;
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  resultImageAccess.m_size.m_data[0] = 0;
  resultImageAccess.m_size.m_data[1] = 0;
  resultImageAccess.m_size.m_data[2] = 0;
  resultImageAccess.m_pitch.m_data[0] = 0;
  resultImageAccess.m_pitch.m_data[1] = 0;
  resultImageAccess.m_pitch.m_data[2] = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if (local_4c0._0_8_ != (long)local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  commandBuffer = local_288;
  beginCommandBuffer(vk,local_288);
  local_1b8 = 1;
  uStack_1b0 = 1;
  local_1a8 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,1,0x80,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)renderSize.m_data;
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  resultImageAccess.m_size.m_data[0] = 0;
  resultImageAccess.m_size.m_data[1] = 0x3f800000;
  beginRenderPass(vk,commandBuffer,local_2b8,local_138,(VkRect2D *)&colorAttachmentLayoutBarrier,
                  (Vec4 *)&resultImageAccess);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,local_178);
  (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,0,local_268.m_internal,0,1,&local_498,0,0);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,commandBuffer,0,1,&local_60);
  (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,10,1,0,0);
  endRenderPass(vk,commandBuffer);
  local_1d8 = 1;
  uStack_1d0 = 1;
  local_1c8 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,commandBuffer,
             local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             local_d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             local_d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x1000,0x4000,0,0,0,1,&colorAttachmentLayoutBarrier,0,0);
  endCommandBuffer(vk,commandBuffer);
  submitCommandsAndWait(vk,device,local_298,commandBuffer);
  pAVar9 = local_d8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_d8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_d8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&colorAttachmentLayoutBarrier);
  tcu::ImageIO::loadPNG
            ((TextureLevel *)&colorAttachmentLayoutBarrier,
             ((pUVar8->super_TestInstance).m_context)->m_testCtx->m_curArchive,
             (pUVar8->m_caseDef).referenceImagePath._M_dataplus._M_p);
  local_4c0._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&resultImageAccess,(TextureFormat *)local_4c0,renderSize.m_data[0],renderSize.m_data[1]
             ,1,pAVar9->m_hostPtr);
  pTVar5 = ((pUVar8->super_TestInstance).m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)local_4c0,(TextureLevel *)&colorAttachmentLayoutBarrier);
  bVar10 = tcu::fuzzyCompare(pTVar5,"ImageComparison","Image Comparison",
                             (ConstPixelBufferAccess *)local_4c0,&resultImageAccess,0.02,
                             COMPARE_LOG_RESULT);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&colorAttachmentLayoutBarrier);
  pAVar9 = local_a8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_a8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_a8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  puVar6 = (uint *)pAVar9->m_hostPtr;
  uVar2 = *puVar6;
  if ((int)uVar2 < iVar12) {
    colorAttachmentLayoutBarrier._0_8_ = ((pUVar8->super_TestInstance).m_context)->m_testCtx->m_log;
    ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar1,"Failure: got ",0xd);
    std::ostream::operator<<(ppvVar1,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppvVar1," vertices, but expected at least ",0x21);
    std::ostream::operator<<(ppvVar1,iVar12);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&colorAttachmentLayoutBarrier,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    std::ios_base::~ios_base(local_3c0);
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&colorAttachmentLayoutBarrier,"Wrong number of vertices","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  }
  else {
    IVar3 = (pUVar8->m_caseDef).ioType;
    if ((ulong)IVar3 < 3) {
      uVar17 = *(uint *)(&DAT_00b1d5c8 + (ulong)IVar3 * 4);
    }
    else {
      uVar17 = (uint)(IVar3 != IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 3 + 2;
    }
    pTVar5 = ((pUVar8->super_TestInstance).m_context)->m_testCtx->m_log;
    pSVar16 = (pUVar8->m_tesInputs).
              super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pUVar8->m_tesInputs).
                            super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar16) >> 4) < 1) {
      iVar11 = 0;
    }
    else {
      lVar19 = 0;
      lVar21 = 0;
      iVar11 = 0;
      do {
        iVar12 = (**(code **)(**(long **)((long)&pSVar16->m_ptr + lVar19) + 0x38))();
        iVar11 = iVar11 + iVar12;
        lVar21 = lVar21 + 1;
        pSVar16 = (pUVar8->m_tesInputs).
                  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = lVar19 + 0x10;
      } while (lVar21 < (int)((ulong)((long)(pUVar8->m_tesInputs).
                                            super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar16) >> 4));
    }
    if (0 < (int)uVar2) {
      uVar20 = 0;
      do {
        colorAttachmentLayoutBarrier._0_8_ = pTVar5;
        if (iVar11 * uVar17 < puVar6[uVar20 + 1]) {
          ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,"Failure: out_te_firstFailedInputIndex has value ",0x30);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,", but should be in range [0, ",0x1d);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar1,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
          std::ios_base::~ios_base(local_3c0);
          colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&colorAttachmentLayoutBarrier,"Invalid values returned from shader",
                     "");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,
                     colorAttachmentLayoutBarrier._0_8_,
                     (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
          goto LAB_00786eaf;
        }
        if (puVar6[uVar20 + 1] != iVar11 * uVar17) {
          ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,
                     "Failure: in tessellation evaluation shader, check for input ",0x3c);
          uVar2 = puVar6[uVar20 + 1];
          if ((int)uVar2 < 1) {
            iVar12 = 0;
            iVar11 = 0;
          }
          else {
            iVar11 = 0;
            iVar12 = 0;
            do {
              iVar18 = (*((pUVar8->m_tesInputs).
                          super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar11].m_ptr)->
                         _vptr_TopLevelObject[7])();
              iVar12 = iVar12 + iVar18 * uVar17;
              iVar11 = iVar11 + 1;
            } while (iVar12 < (int)uVar2);
          }
          if ((int)uVar2 < iVar12) {
            lVar19 = (long)(iVar11 + -1);
            iVar11 = (*((pUVar8->m_tesInputs).
                        super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar19].m_ptr)->
                       _vptr_TopLevelObject[7])();
            iVar12 = iVar12 - iVar11 * uVar17;
          }
          else {
            lVar19 = (long)iVar11;
          }
          pTVar7 = (pUVar8->m_tesInputs).
                   super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar19].m_ptr;
          (*pTVar7->_vptr_TopLevelObject[8])
                    (&resultImageAccess,pTVar7,(ulong)(uVar2 - iVar12),(ulong)uVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar1,(char *)resultImageAccess.m_format,
                     resultImageAccess.m_size.m_data._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar1," failed",7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
          if (resultImageAccess.m_format != (TextureFormat)(resultImageAccess.m_size.m_data + 2)) {
            operator_delete((void *)resultImageAccess.m_format,resultImageAccess._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
          std::ios_base::~ios_base(local_3c0);
          colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&colorAttachmentLayoutBarrier,
                     "Invalid input value in tessellation evaluation shader","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,
                     colorAttachmentLayoutBarrier._0_8_,
                     (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
          goto LAB_00786eaf;
        }
        uVar20 = uVar20 + 1;
      } while (uVar2 != uVar20);
    }
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    if (bVar10) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colorAttachmentLayoutBarrier,"OK","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,colorAttachmentLayoutBarrier._0_8_
                 ,(long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&colorAttachmentLayoutBarrier,"Image comparison failed","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,colorAttachmentLayoutBarrier._0_8_
                 ,(long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
    }
  }
LAB_00786eaf:
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ !=
      &colorAttachmentLayoutBarrier.srcAccessMask) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    colorAttachmentLayoutBarrier._16_8_ + 1);
  }
  if (local_178 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_170,(VkPipeline)local_178);
  }
  if (commandBuffer != (VkCommandBuffer)0x0) {
    colorAttachmentLayoutBarrier._0_8_ = commandBuffer;
    (**(code **)(*plStack_280 + 0x240))(plStack_280,_local_278,_VStack_270,1);
  }
  if (local_158.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_150,local_158);
  }
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_260,local_268);
  }
  if (local_138.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_130,local_138);
  }
  if (local_2b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_2b0,local_2b8);
  }
  if (local_118.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_110,local_118);
  }
  if (local_498 != 0) {
    colorAttachmentLayoutBarrier._0_8_ = local_498;
    (**(code **)(*plStack_490 + 0x1e8))(plStack_490,_local_488,_VStack_480,1);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_f0,local_f8);
  }
  if (local_248 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_240,(VkDescriptorSetLayout)local_248);
  }
  if (local_d8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_d8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_d8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_d8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_208.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  if (local_a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_60.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_60.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_60.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_60.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_60.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_60.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus UserDefinedIOTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int				numAttributes				= NUM_TESS_LEVELS + 2 + 2;
	static const float		attributes[numAttributes]	= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const int				refNumVertices				= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const int				refNumUniqueVertices		= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, true, &attributes[0], &attributes[2]);

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat				= VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride				= tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes		= numAttributes * vertexStride;
	const Buffer       vertexBuffer				(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Output buffer: number of invocations and verification indices

	const int		   resultBufferMaxVertices	= refNumVertices;
	const VkDeviceSize resultBufferSizeBytes    = sizeof(deInt32) + resultBufferMaxVertices * sizeof(deUint32);
	const Buffer       resultBuffer             (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>      colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>     renderPass         (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>    framebuffer        (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout> pipelineLayout     (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool            (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer          (allocateCommandBuffer (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize                (renderSize)
		.setPatchControlPoints        (numAttributes)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	// Begin draw

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, numAttributes, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verification

	bool isImageCompareOK = false;
	{
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		// Load reference image
		tcu::TextureLevel referenceImage;
		tcu::ImageIO::loadPNG(referenceImage, m_context.getTestContext().getArchive(), m_caseDef.referenceImagePath.c_str());

		// Verify case result
		const tcu::ConstPixelBufferAccess resultImageAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());
		isImageCompareOK = tcu::fuzzyCompare(m_context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
											 referenceImage.getAccess(), resultImageAccess, 0.02f, tcu::COMPARE_LOG_RESULT);
	}
	{
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32			numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
		const deUint32* const	vertices    = reinterpret_cast<deUint32*>(static_cast<deUint8*>(resultAlloc.getHostPtr()) + sizeof(deInt32));

		// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
		DE_ASSERT(numVertices <= refNumVertices);

		if (numVertices < refNumUniqueVertices)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: got " << numVertices << " vertices, but expected at least " << refNumUniqueVertices << tcu::TestLog::EndMessage;

			return tcu::TestStatus::fail("Wrong number of vertices");
		}
		else
		{
			tcu::TestLog&	log					= m_context.getTestContext().getLog();
			const int		topLevelArraySize	= (m_caseDef.ioType == IO_TYPE_PER_PATCH			? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: NUM_OUTPUT_VERTICES);
			const deUint32	numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < numVertices; ++vertexNdx)
				if (vertices[vertexNdx] > numTEInputs)
				{
					log << tcu::TestLog::Message
						<< "Failure: out_te_firstFailedInputIndex has value " << vertices[vertexNdx]
						<< ", but should be in range [0, " << numTEInputs << "]" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid values returned from shader");
				}
				else if (vertices[vertexNdx] != numTEInputs)
				{
					log << tcu::TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
						<< basicSubobjectAtIndex(vertices[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid input value in tessellation evaluation shader");
				}
		}
	}
	return (isImageCompareOK ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}